

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

void __thiscall CMU462::Application::switch_modes(Application *this,uint key)

{
  if ((int)key < 0x61) {
    if (0x51 < (int)key) {
      if (key == 0x52) {
LAB_00193c9f:
        to_render_mode(this);
        goto LAB_00193ca7;
      }
      if (key != 0x56) {
        return;
      }
LAB_00193c8b:
      to_visualize_mode(this);
      goto LAB_00193ca7;
    }
    if (key == 0x41) {
LAB_00193c95:
      to_animate_mode(this);
      goto LAB_00193ca7;
    }
    if (key != 0x4d) {
      return;
    }
  }
  else {
    if (0x71 < (int)key) {
      if (key == 0x72) goto LAB_00193c9f;
      if (key != 0x76) {
        return;
      }
      goto LAB_00193c8b;
    }
    if (key == 0x61) goto LAB_00193c95;
    if (key != 0x6d) {
      return;
    }
  }
  to_model_mode(this);
LAB_00193ca7:
  setupElementTransformWidget(this);
  return;
}

Assistant:

void Application::switch_modes(unsigned int key) {
  switch (key) {
    case 'a':
    case 'A':
      to_animate_mode();
      setupElementTransformWidget();
      break;
    case 'm':
    case 'M':
      to_model_mode();
      setupElementTransformWidget();
      break;
    case 'r':
    case 'R':
      to_render_mode();
      setupElementTransformWidget();
      break;
    case 'v':
    case 'V':
      to_visualize_mode();
      setupElementTransformWidget();
      break;
    default:
      break;
  }
}